

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

void Extra_ThreshSimplifyInequalities
               (int nInequalities,int nChows,unsigned_long **pGreaters,unsigned_long **pSmallers)

{
  int local_28;
  int local_24;
  int k;
  int i;
  unsigned_long **pSmallers_local;
  unsigned_long **pGreaters_local;
  int nChows_local;
  int nInequalities_local;
  
  for (local_28 = 0; local_28 < nInequalities; local_28 = local_28 + 1) {
    for (local_24 = 0; local_24 < nChows; local_24 = local_24 + 1) {
      if (pGreaters[local_28][local_24] == pSmallers[local_28][local_24]) {
        pGreaters[local_28][local_24] = 0;
        pSmallers[local_28][local_24] = 0;
      }
      else if (pSmallers[local_28][local_24] < pGreaters[local_28][local_24]) {
        pGreaters[local_28][local_24] =
             pGreaters[local_28][local_24] - pSmallers[local_28][local_24];
        pSmallers[local_28][local_24] = 0;
      }
      else {
        pSmallers[local_28][local_24] =
             pSmallers[local_28][local_24] - pGreaters[local_28][local_24];
        pGreaters[local_28][local_24] = 0;
      }
    }
  }
  return;
}

Assistant:

void Extra_ThreshSimplifyInequalities(int nInequalities, int nChows,
        unsigned long ** pGreaters, unsigned long ** pSmallers) {
    int i = 0, k = 0;

    for (k = 0; k < nInequalities; k++) {
        for (i = 0; i < nChows; i++) {
            if ((pGreaters[k][i]) == (pSmallers[k][i])) {
                pGreaters[k][i] = 0;
                pSmallers[k][i] = 0;
            } else if ((pGreaters[k][i]) > (pSmallers[k][i])) {
                pGreaters[k][i] = pGreaters[k][i] - pSmallers[k][i];
                pSmallers[k][i] = 0;
            } else {
                pSmallers[k][i] = pSmallers[k][i] - pGreaters[k][i];
                ;
                pGreaters[k][i] = 0;
            }
        }
    }
//        Extra_ThreshPrintInequalities( pGreaters, pSmallers, nChows, nInequalities);
//        printf( "\nInequalities was Siplified \n");
}